

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

ssize_t __thiscall
QDecompressHelper::read(QDecompressHelper *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  ssize_t sVar2;
  qsizetype qVar3;
  undefined4 in_register_00000034;
  char *data;
  bool bVar4;
  
  data = (char *)CONCAT44(in_register_00000034,__fd);
  if (0 < (long)__buf) {
    if (this->contentEncoding == None) {
      return -1;
    }
    bVar4 = (this->compressedDataBuffer).bufferCompleteSize != 0;
    lVar1 = (this->decompressedDataBuffer).bufferCompleteSize;
    if (lVar1 != 0 || (bVar4 || (this->decoderHasData & 1U) != 0)) {
      if (lVar1 == 0) {
        sVar2 = 0;
      }
      else {
        sVar2 = QByteDataBuffer::read
                          (&this->decompressedDataBuffer,__fd,__buf,
                           CONCAT71((int7)(__nbytes >> 8),bVar4 | this->decoderHasData));
        data = data + sVar2;
        __buf = (void *)((long)__buf - sVar2);
      }
      qVar3 = readInternal(this,data,(qsizetype)__buf);
      if (qVar3 == -1) {
        return -1;
      }
      this->totalBytesRead = this->totalBytesRead + qVar3 + sVar2;
      return qVar3 + sVar2;
    }
  }
  return 0;
}

Assistant:

qsizetype QDecompressHelper::read(char *data, qsizetype maxSize)
{
    if (maxSize <= 0)
        return 0;

    if (!isValid())
        return -1;

    if (!hasData())
        return 0;

    qsizetype cachedRead = 0;
    if (!decompressedDataBuffer.isEmpty()) {
        cachedRead = decompressedDataBuffer.read(data, maxSize);
        data += cachedRead;
        maxSize -= cachedRead;
    }

    qsizetype bytesRead = readInternal(data, maxSize);
    if (bytesRead == -1)
        return -1;
    totalBytesRead += bytesRead + cachedRead;
    return bytesRead + cachedRead;
}